

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  constraint_t<QString> *pcVar1;
  undefined8 *puVar2;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  exception_t<cfgfile::qstring_trait_t> *peVar5;
  undefined8 *puVar6;
  allocator<char> local_26d;
  allocator<char> local_26c;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  string_t local_268;
  string_t local_250;
  qstring_wrapper_t local_238;
  qstring_wrapper_t local_220;
  qstring_wrapper_t local_208;
  qstring_wrapper_t local_1f0;
  qstring_wrapper_t local_1d8;
  qstring_wrapper_t local_1c0;
  qstring_wrapper_t local_1a8;
  string_t local_190;
  string_t local_178;
  string_t local_160;
  string_t local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string_t local_90;
  qstring_wrapper_t local_78;
  qstring_wrapper_t local_60;
  qstring_wrapper_t local_48;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<QString> *)0x0) {
    iVar4 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&this->m_value);
    if ((char)iVar4 == '\0') {
      peVar5 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Invalid value: \"",&local_26a);
      qstring_trait_t::from_ascii(&local_250,&local_b0);
      local_268.m_str.d.d = (this->m_value).d.d;
      local_268.m_str.d.ptr = (this->m_value).d.ptr;
      local_268.m_str.d.size = (this->m_value).d.size;
      if (local_268.m_str.d.d != (Data *)0x0) {
        LOCK();
        ((local_268.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_268.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      operator+(&local_238,&local_250,&local_268);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"\". Value must match to the constraint in tag \"",&local_26b);
      qstring_trait_t::from_ascii(&local_148,&local_d0);
      operator+(&local_220,&local_238,&local_148);
      operator+(&local_208,&local_220,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\". In file \"",&local_26c);
      qstring_trait_t::from_ascii(&local_160,&local_f0);
      operator+(&local_1f0,&local_208,&local_160);
      operator+(&local_1d8,&local_1f0,&info->m_file_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"\" on line ",&local_26d);
      qstring_trait_t::from_ascii(&local_178,&local_110);
      operator+(&local_1c0,&local_1d8,&local_178);
      qstring_trait_t::to_string(&local_190,info->m_line_number);
      operator+(&local_1a8,&local_1c0,&local_190);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,".",&local_269);
      qstring_trait_t::from_ascii(&local_90,&local_130);
      operator+(&local_48,&local_1a8,&local_90);
      exception_t<cfgfile::qstring_trait_t>::exception_t(peVar5,&local_48);
      __cxa_throw(peVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined != false) {
    iVar4 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    puVar6 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
    puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
    do {
      if (puVar6 == puVar2) {
        return;
      }
      this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar6;
      if (this_00->m_is_mandatory == true) {
        bVar3 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
        if (!bVar3) {
          peVar5 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"Undefined child mandatory tag: \"",
                     (allocator<char> *)&local_90);
          qstring_trait_t::from_ascii(&local_250,&local_b0);
          operator+(&local_238,&local_250,&this_00->m_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"\". Where parent is: \"",&local_26a);
          qstring_trait_t::from_ascii(&local_268,&local_d0);
          operator+(&local_220,&local_238,&local_268);
          operator+(&local_208,&local_220,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"\". In file \"",&local_26b);
          qstring_trait_t::from_ascii(&local_148,&local_f0);
          operator+(&local_1f0,&local_208,&local_148);
          operator+(&local_1d8,&local_1f0,&info->m_file_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"\" on line ",&local_26c);
          qstring_trait_t::from_ascii(&local_160,&local_110);
          operator+(&local_1c0,&local_1d8,&local_160);
          qstring_trait_t::to_string(&local_178,info->m_line_number);
          operator+(&local_1a8,&local_1c0,&local_178);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,".",&local_26d);
          qstring_trait_t::from_ascii(&local_190,&local_130);
          operator+(&local_78,&local_1a8,&local_190);
          exception_t<cfgfile::qstring_trait_t>::exception_t(peVar5,&local_78);
          __cxa_throw(peVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
      }
      puVar6 = puVar6 + 1;
    } while( true );
  }
  peVar5 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Undefined value of tag: \"",(allocator<char> *)&local_148);
  qstring_trait_t::from_ascii(&local_208,&local_b0);
  operator+(&local_1f0,&local_208,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"\". In file \"",(allocator<char> *)&local_160);
  qstring_trait_t::from_ascii(&local_220,&local_d0);
  operator+(&local_1d8,&local_1f0,&local_220);
  operator+(&local_1c0,&local_1d8,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"\" on line ",(allocator<char> *)&local_178);
  qstring_trait_t::from_ascii(&local_238,&local_f0);
  operator+(&local_1a8,&local_1c0,&local_238);
  qstring_trait_t::to_string(&local_250,info->m_line_number);
  operator+((qstring_wrapper_t *)&local_130,&local_1a8,&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,".",(allocator<char> *)&local_190);
  qstring_trait_t::from_ascii(&local_268,&local_110);
  operator+(&local_60,(qstring_wrapper_t *)&local_130,&local_268);
  exception_t<cfgfile::qstring_trait_t>::exception_t(peVar5,&local_60);
  __cxa_throw(peVar5,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t( m_value ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}